

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O3

uint32_t __thiscall
GmmLib::GmmGen7TextureCalc::Get2DMipMapHeight(GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t Height;
  uint uVar5;
  uint uVar6;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t CompressWidth;
  uint32_t CompressDepth;
  ulong local_48;
  uint local_40;
  uint local_3c;
  uint32_t local_38;
  uint32_t CompressHeight;
  
  GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  Height = pTexInfo->BaseHeight;
  CompressHeight._3_1_ =
       GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  local_38 = pTexInfo->MaxLod;
  uVar2 = (pTexInfo->Alignment).VAlign;
  _CompressWidth = &this->super_GmmTextureCalc;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,pTexInfo->Format,&local_58,&local_3c,&local_54);
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar1 = 1;
  }
  else {
    uVar1 = (pTexInfo->MSAA).NumSamples;
  }
  uVar1 = GmmTextureCalc::ExpandHeight(_CompressWidth,Height,uVar2,uVar1);
  if (CompressHeight._3_1_ == '\0') {
    local_40 = uVar1 >> ((byte)((uint)*(undefined4 *)&(pTexInfo->Flags).Gpu >> 0x1d) & 1);
  }
  else {
    local_40 = uVar1 / local_3c;
  }
  if (local_38 == 0) {
    uVar5 = 0;
  }
  else {
    uVar6 = 1;
    uVar4 = 0;
    uVar5 = 0;
    local_48 = (ulong)uVar2;
    do {
      uVar1 = 1;
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
        uVar1 = (pTexInfo->MSAA).NumSamples;
      }
      Height = Height >> 1;
      uVar1 = GmmTextureCalc::ExpandHeight(_CompressWidth,Height,(uint32_t)local_48,uVar1);
      if (CompressHeight._3_1_ == '\0') {
        uVar2 = uVar1 >> ((byte)((uint)*(undefined4 *)&(pTexInfo->Flags).Gpu >> 0x1d) & 1);
      }
      else {
        uVar2 = uVar1 / local_3c;
      }
      uVar3 = uVar2;
      if (uVar6 == 1) {
        uVar3 = 0;
        uVar5 = uVar2;
      }
      uVar4 = uVar4 + uVar3;
      uVar6 = uVar6 + 1;
    } while (uVar6 <= local_38);
    uVar2 = (uint)local_48;
    if (uVar5 < uVar4) goto LAB_001a4c1a;
  }
  uVar4 = uVar5;
LAB_001a4c1a:
  if (uVar2 != 0) {
    uVar4 = (uVar2 - 1) + uVar4;
    uVar4 = uVar4 - uVar4 % uVar2;
  }
  return uVar4 + local_40;
}

Assistant:

uint32_t GmmLib::GmmGen7TextureCalc::Get2DMipMapHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t Height, BlockHeight, NumLevels; // Final height for 2D surface
    uint32_t HeightLines, HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t VAlign, CompressHeight, CompressWidth, CompressDepth;
    uint32_t i;
    uint8_t  Compress;

    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // Mip 0 height is needed later
    Height      = pTexInfo->BaseHeight;
    Compress    = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    NumLevels   = pTexInfo->MaxLod;
    HeightLines = Height;
    VAlign      = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, HeightLines, VAlign, pTexInfo);

    if(Compress)
    {
        HeightLinesLevel0 /= CompressHeight;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil)
    {
        HeightLinesLevel0 /= 2;
    }

    // Start out with mip0
    BlockHeight = HeightLinesLevel0;

    // Height of mip1 and height of all others mips(2,3,4,5,,) needed later
    HeightLinesLevel1 = HeightLinesLevel2 = 0;
    for(i = 1; i <= NumLevels; i++)
    {
        uint32_t AlignedHeightLines;

        HeightLines >>= 1;

        AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, HeightLines, VAlign, pTexInfo);

        if(Compress)
        {
            AlignedHeightLines /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            AlignedHeightLines /= 2;
        }

        if(i == 1)
        {
            HeightLinesLevel1 = AlignedHeightLines;
        }
        else
        {
            HeightLinesLevel2 += AlignedHeightLines;
        }
    }

    // If mip1 height covers all others then that is all we need
    if(HeightLinesLevel1 >= HeightLinesLevel2)
    {
        BlockHeight += GFX_ALIGN_NP2(HeightLinesLevel1, VAlign);
    }
    else
    {
        BlockHeight += GFX_ALIGN_NP2(HeightLinesLevel2, VAlign);
    }

    GMM_DPF_EXIT;
    return (BlockHeight);
}